

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnLocalDecl
          (BinaryReaderInterp *this,Index decl_index,Index count,Type type)

{
  bool bVar1;
  value_type local_34;
  Enum local_28;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index count_local;
  Index decl_index_local;
  BinaryReaderInterp *this_local;
  Type type_local;
  
  local_28 = type.enum_;
  local_20 = count;
  local_1c = decl_index;
  _count_local = this;
  this_local._0_4_ = type.enum_;
  local_24 = (Enum)SharedValidator::OnLocalDecl
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,count,type)
  ;
  bVar1 = Failed((Result)local_24);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    this->local_count_ = local_20 + this->local_count_;
    local_34.type.enum_ = this_local._0_4_;
    local_34.count = local_20;
    local_34.end = this->local_count_;
    std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::push_back
              (&this->func_->locals,&local_34);
    if (local_1c == this->local_decl_count_ - 1) {
      Istream::Emit(this->istream_,InterpAlloca,this->local_count_);
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnLocalDecl(Index decl_index,
                                       Index count,
                                       Type type) {
  CHECK_RESULT(validator_.OnLocalDecl(loc, count, type));

  local_count_ += count;
  func_->locals.push_back(LocalDesc{type, count, local_count_});

  if (decl_index == local_decl_count_ - 1) {
    istream_.Emit(Opcode::InterpAlloca, local_count_);
  }
  return Result::Ok;
}